

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointSpeedParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *parentpos,ChVector<double> *parentspeed)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector<double> v;
  ChVector<double> localpos;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_f0;
  undefined1 local_e8 [16];
  double local_d8;
  ChVector<double> local_c8;
  ChQuaternion<double> local_a8;
  ChQuaternion<double> local_88;
  ChQuaternion<double> local_68;
  ChQuaternion<double> local_48;
  
  ChFrame<double>::TransformParentToLocal(&local_c8,&this->super_ChFrame<double>,parentpos);
  local_f0.m_matrix = &(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>;
  dVar1 = parentspeed->m_data[2];
  dVar2 = (this->coord_dt).pos.m_data[2];
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = local_c8.m_data[0];
  local_88.m_data[2] = local_c8.m_data[1];
  local_88.m_data[3] = local_c8.m_data[2];
  auVar3 = vsubpd_avx(*(undefined1 (*) [16])parentspeed->m_data,
                      *(undefined1 (*) [16])(this->coord_dt).pos.m_data);
  ChQuaternion<double>::operator%(&local_68,&(this->coord_dt).rot,&local_88);
  local_a8.m_data[0] = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar5._0_8_ = -(this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar5._8_4_ = 0;
  auVar5._12_4_ = 0x80000000;
  local_a8.m_data[1]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 1);
  local_a8.m_data[2]._0_4_ = *(undefined4 *)((this->super_ChFrame<double>).coord.rot.m_data + 2);
  local_a8.m_data[1]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0xc) ^ 0x80000000;
  local_a8.m_data[2]._4_4_ =
       *(uint *)((long)(this->super_ChFrame<double>).coord.rot.m_data + 0x14) ^ 0x80000000;
  local_a8.m_data[3] = (double)vmovlps_avx(auVar5);
  ChQuaternion<double>::operator%(&local_48,&local_68,&local_a8);
  auVar4._0_8_ = local_48.m_data[1] + local_48.m_data[1];
  auVar4._8_8_ = local_48.m_data[2] + local_48.m_data[2];
  local_e8 = vsubpd_avx(auVar3,auVar4);
  local_d8 = (dVar1 - dVar2) - (local_48.m_data[3] + local_48.m_data[3]);
  operator*(&local_f0,(ChVector<double> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointSpeedParentToLocal(const ChVector<Real>& parentpos, const ChVector<Real>& parentspeed) const {
        ChVector<Real> localpos = ChFrame<Real>::TransformParentToLocal(parentpos);
        return this->Amatrix.transpose() *
               (parentspeed - coord_dt.pos -
                ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2));
    }